

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiDockNode * ImGui::DockContextAddNode(ImGuiContext_conflict1 *ctx,ImGuiID id)

{
  int *piVar1;
  void *pvVar2;
  ImGuiDockNode *this;
  ImGuiDockContext *this_00;
  
  this_00 = &ctx->DockContext;
  if (id == 0) {
    id = 0;
    do {
      id = id + 1;
      pvVar2 = ImGuiStorage::GetVoidPtr(&this_00->Nodes,id);
    } while (pvVar2 != (void *)0x0);
  }
  else {
    pvVar2 = ImGuiStorage::GetVoidPtr(&this_00->Nodes,id);
    if (pvVar2 != (void *)0x0) {
      __assert_fail("DockContextFindNodeByID(ctx, id) == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x32b4,"ImGuiDockNode *ImGui::DockContextAddNode(ImGuiContext *, ImGuiID)");
    }
  }
  if (GImGui != (ImGuiContext_conflict1 *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  this = (ImGuiDockNode *)(*GImAllocatorAllocFunc)(0xc0,GImAllocatorUserData);
  ImGuiDockNode::ImGuiDockNode(this,id);
  ImGuiStorage::SetVoidPtr(&this_00->Nodes,this->ID,this);
  return this;
}

Assistant:

static ImGuiDockNode* ImGui::DockContextAddNode(ImGuiContext* ctx, ImGuiID id)
{
    // Generate an ID for the new node (the exact ID value doesn't matter as long as it is not already used) and add the first window.
    if (id == 0)
        id = DockContextGenNodeID(ctx);
    else
        IM_ASSERT(DockContextFindNodeByID(ctx, id) == NULL);

    // We don't set node->LastFrameAlive on construction. Nodes are always created at all time to reflect .ini settings!
    IMGUI_DEBUG_LOG_DOCKING("DockContextAddNode 0x%08X\n", id);
    ImGuiDockNode* node = IM_NEW(ImGuiDockNode)(id);
    ctx->DockContext.Nodes.SetVoidPtr(node->ID, node);
    return node;
}